

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

void updateFormLayoutItem
               (QFormLayoutItem *item,int userVSpacing,FieldGrowthPolicy fieldGrowthPolicy,
               bool fullRow)

{
  uint uVar1;
  int iVar2;
  QSize QVar3;
  QSize QVar4;
  QSize QVar5;
  undefined3 in_register_00000009;
  Representation extraout_var;
  Representation extraout_var_00;
  Representation extraout_var_01;
  
  QVar3.wd.m_i = (*item->item->_vptr_QLayoutItem[3])();
  QVar3.ht.m_i = extraout_var.m_i;
  item->minSize = QVar3;
  QVar4.wd.m_i = (*item->item->_vptr_QLayoutItem[2])();
  QVar4.ht.m_i = extraout_var_00.m_i;
  item->sizeHint = QVar4;
  QVar5.wd.m_i = (*item->item->_vptr_QLayoutItem[4])();
  QVar5.ht.m_i = extraout_var_01.m_i;
  item->maxSize = QVar5;
  if (CONCAT31(in_register_00000009,fullRow) != 0) goto LAB_0037ab7a;
  if (fieldGrowthPolicy != FieldsStayAtSizeHint) {
    if (fieldGrowthPolicy != ExpandingFieldsGrow) goto LAB_0037ab7a;
    uVar1 = (*item->item->_vptr_QLayoutItem[5])();
    if ((uVar1 & 1) != 0) goto LAB_0037ab7a;
  }
  (item->maxSize).wd.m_i = (item->sizeHint).wd.m_i;
LAB_0037ab7a:
  iVar2 = (*item->item->_vptr_QLayoutItem[9])();
  item->isHfw = SUB41(iVar2,0);
  item->vSpace = userVSpacing;
  return;
}

Assistant:

static void updateFormLayoutItem(QFormLayoutItem *item, int userVSpacing,
                                        QFormLayout::FieldGrowthPolicy fieldGrowthPolicy,
                                        bool fullRow)
{
    item->minSize = item->item->minimumSize();
    item->sizeHint = item->item->sizeHint();
    item->maxSize = item->item->maximumSize();

    if (!fullRow && (fieldGrowthPolicy == QFormLayout::FieldsStayAtSizeHint
                     || (fieldGrowthPolicy == QFormLayout::ExpandingFieldsGrow
                         && !(item->item->expandingDirections() & Qt::Horizontal))))
        item->maxSize.setWidth(item->sizeHint.width());

    item->isHfw = item->item->hasHeightForWidth();
    item->vSpace = userVSpacing;
}